

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O3

void w256_to_bitstream(bitstream_t *bs,word256 v,size_t width,size_t size)

{
  sbyte sVar1;
  ulong *puVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong auStack_68 [12];
  
  puVar2 = auStack_68 + width;
  if (0x3f < size) {
    do {
      uVar10 = bs->position;
      uVar3 = *puVar2;
      pbVar6 = (bs->buffer).w + (uVar10 >> 3);
      uVar8 = (uint)uVar10 & 7;
      bs->position = uVar10 + 0x40;
      if ((uVar10 & 7) == 0) {
        uVar10 = 0x40;
      }
      else {
        uVar10 = (ulong)(uVar8 | 0x38);
        *pbVar6 = (byte)(uVar3 >> uVar10) |
                  (byte)(0xff << ((byte)(8 - (char)uVar8) & 0x1f)) & *pbVar6;
        pbVar6 = pbVar6 + 1;
      }
      do {
        uVar10 = uVar10 - 8;
        *pbVar6 = (byte)(uVar3 >> (uVar10 & 0x3f));
        pbVar6 = pbVar6 + 1;
      } while (7 < uVar10);
      if (uVar10 != 0) {
        bVar4 = (byte)uVar10;
        sVar1 = (bVar4 < 0x21) * (' ' - bVar4);
        *pbVar6 = (char)((uint)((int)uVar3 << sVar1) >> sVar1) << ((ulong)(byte)(8 - bVar4) & 0x3f)
                  | (byte)(0xff >> ((uint)uVar10 & 0x1f)) & *pbVar6;
      }
      size = size - 0x40;
      puVar2 = puVar2 + -1;
    } while (0x3f < size);
  }
  if (size != 0) {
    uVar10 = bs->position;
    uVar8 = (uint)size;
    uVar3 = *puVar2 >> ((ulong)(byte)-(char)size & 0x3f);
    pbVar6 = (bs->buffer).w + (uVar10 >> 3);
    uVar9 = (uint)uVar10 & 7;
    bs->position = uVar10 + size;
    if ((uVar10 & 7) != 0) {
      uVar5 = 8 - uVar9;
      uVar7 = uVar8;
      if (uVar5 < uVar8) {
        uVar7 = uVar5;
      }
      size = (size_t)(uVar8 - uVar7);
      *pbVar6 = (byte)((uVar3 >> (size & 0x3f)) << ((ulong)(uVar5 - uVar7) & 0x3f)) |
                ((byte)(0xff >> (uVar9 + uVar7 & 0x1f)) | (byte)(0xff << (uVar5 & 0x1f))) & *pbVar6;
      pbVar6 = pbVar6 + 1;
    }
    if (7 < (uint)size) {
      size = size & 0xffffffff;
      do {
        size = size - 8;
        *pbVar6 = (byte)(uVar3 >> (size & 0x3f));
        pbVar6 = pbVar6 + 1;
      } while (7 < size);
    }
    if ((uint)size != 0) {
      bVar4 = (byte)size;
      sVar1 = (bVar4 < 0x21) * (' ' - bVar4);
      *pbVar6 = (char)((uint)((int)uVar3 << sVar1) >> sVar1) << ((ulong)(byte)(8 - bVar4) & 0x3f) |
                (byte)(0xff >> ((uint)size & 0x1f)) & *pbVar6;
    }
  }
  return;
}

Assistant:

ATTR_TARGET_S256
static inline void w256_to_bitstream(bitstream_t* bs, const word256 v, const size_t width,
                                     const size_t size) {
  ATTR_ALIGNED(32) uint64_t buf[4];
  mm256_store(buf, v);

  const uint64_t* d = &buf[width - 1];
  size_t bits       = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    bitstream_put_bits(bs, *d, sizeof(uint64_t) * 8);
  }
  if (bits) {
    bitstream_put_bits(bs, *d >> (sizeof(uint64_t) * 8 - bits), bits);
  }
}